

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O0

void __thiscall xray_re::_lzhuf::InsertNode(_lzhuf *this,int r)

{
  uint uVar1;
  uint c;
  uchar *key;
  int cmp;
  int p;
  int i;
  int r_local;
  _lzhuf *this_local;
  
  key._0_4_ = 1;
  key._4_4_ = this->text_buf[r] + 0x1001;
  this->lson[r] = 0x1000;
  this->rson[r] = 0x1000;
  this->match_length = 0;
  do {
    do {
      if ((int)key < 0) {
        if (this->lson[key._4_4_] == 0x1000) {
          this->lson[key._4_4_] = r;
          this->dad[r] = key._4_4_;
          return;
        }
        key._4_4_ = this->lson[key._4_4_];
      }
      else {
        if (this->rson[key._4_4_] == 0x1000) {
          this->rson[key._4_4_] = r;
          this->dad[r] = key._4_4_;
          return;
        }
        key._4_4_ = this->rson[key._4_4_];
      }
      cmp = 1;
      while ((cmp < 0x3c &&
             (key._0_4_ = (uint)(this->text_buf + r)[cmp] - (uint)this->text_buf[key._4_4_ + cmp],
             (int)key == 0))) {
        cmp = cmp + 1;
      }
    } while (cmp < 3);
    if (this->match_length < cmp) {
      this->match_position = (r - key._4_4_ & 0xfffU) - 1;
      this->match_length = cmp;
      if (0x3b < cmp) {
        this->dad[r] = this->dad[key._4_4_];
        this->lson[r] = this->lson[key._4_4_];
        this->rson[r] = this->rson[key._4_4_];
        this->dad[this->lson[key._4_4_]] = r;
        this->dad[this->rson[key._4_4_]] = r;
        if (this->rson[this->dad[key._4_4_]] == key._4_4_) {
          this->rson[this->dad[key._4_4_]] = r;
        }
        else {
          this->lson[this->dad[key._4_4_]] = r;
        }
        this->dad[key._4_4_] = 0x1000;
        return;
      }
    }
    if ((cmp == this->match_length) &&
       (uVar1 = (r - key._4_4_ & 0xfffU) - 1, uVar1 < (uint)this->match_position)) {
      this->match_position = uVar1;
    }
  } while( true );
}

Assistant:

void _lzhuf::InsertNode(int r)  /* insert to tree */
{
	int  i, p, cmp;
	unsigned char  *key;
	unsigned c;

	cmp = 1;
	key = &text_buf[r];
	p = N + 1 + key[0];
	rson[r] = lson[r] = NIL;
	match_length = 0;
	for ( ; ; ) {
		if (cmp >= 0) {
			if (rson[p] != NIL)
				p = rson[p];
			else {
				rson[p] = r;
				dad[r] = p;
				return;
			}
		} else {
			if (lson[p] != NIL)
				p = lson[p];
			else {
				lson[p] = r;
				dad[r] = p;
				return;
			}
		}
		for (i = 1; i < F; i++)
			if ((cmp = key[i] - text_buf[p + i]) != 0)
				break;
		if (i > THRESHOLD) {
			if (i > match_length) {
				match_position = ((r - p) & (N - 1)) - 1;
				if ((match_length = i) >= F)
					break;
			}
			if (i == match_length) {
				if ((c = ((r - p) & (N - 1)) - 1) < (unsigned)match_position) {
					match_position = c;
				}
			}
		}
	}
	dad[r] = dad[p];
	lson[r] = lson[p];
	rson[r] = rson[p];
	dad[lson[p]] = r;
	dad[rson[p]] = r;
	if (rson[dad[p]] == p)
		rson[dad[p]] = r;
	else
		lson[dad[p]] = r;
	dad[p] = NIL;  /* remove p */
}